

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::SerializeInternal
               (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
               CodedOutputStream *output)

{
  double *field;
  float fVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  FieldMetadata *field_metadata;
  uint32 *has_bits_array;
  undefined8 uStack_38;
  
  if (0 < num_fields) {
    uVar3 = (ulong)(uint)num_fields;
    uStack_38 = in_RAX;
    do {
      uVar2 = field_metadata_table->type;
      if (100 < uVar2) {
switchD_001cacfa_caseD_12:
        SerializeNotImplemented(uVar2);
        goto LAB_001cb53d;
      }
      field = (double *)(base + field_metadata_table->offset);
      switch(uVar2) {
      case 0:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb240:
          SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 1:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb1ee:
          SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 2:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb440:
          uVar2 = field_metadata_table->tag;
LAB_001cb444:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<3>::Serialize(field,output);
        }
        break;
      case 3:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb172:
          uVar2 = field_metadata_table->tag;
LAB_001cb176:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<4>::Serialize(field,output);
        }
        break;
      case 4:
      case 0xd:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x001cad28;
      case 5:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb2ce:
          SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 6:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x001cb084;
      case 7:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb0f0:
          SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 8:
      case 0xb:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cad45:
          uVar2 = field_metadata_table->tag;
LAB_001cad91:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<9>::Serialize((void *)((ulong)*field & 0xfffffffffffffffe),output);
        }
        break;
      case 9:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb217:
          SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 10:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb2ec:
          SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 0xc:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x001cb118;
      case 0xe:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x001caf83;
      case 0xf:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb343:
          SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 0x10:
        fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                        (field_metadata_table->has_offset & 0x1f) & 1);
        goto joined_r0x001cb35b;
      case 0x11:
        if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
             (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_001cb494:
          uVar2 = field_metadata_table->tag;
LAB_001cb498:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<18>::Serialize(field,output);
        }
        break;
      default:
        goto switchD_001cacfa_caseD_12;
      case 0x14:
        if ((*field != 0.0) || (NAN(*field))) goto LAB_001cb240;
        break;
      case 0x15:
        if ((*(float *)field != 0.0) || (NAN(*(float *)field))) goto LAB_001cb1ee;
        break;
      case 0x16:
        if (*field != 0.0) goto LAB_001cb440;
        break;
      case 0x17:
        if (*field != 0.0) goto LAB_001cb172;
        break;
      case 0x18:
      case 0x21:
        fVar1 = *(float *)field;
joined_r0x001cad28:
        if (fVar1 != 0.0) {
          uVar2 = field_metadata_table->tag;
LAB_001cadcc:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<5>::Serialize(field,output);
        }
        break;
      case 0x19:
        if (*field != 0.0) goto LAB_001cb2ce;
        break;
      case 0x1a:
        fVar1 = *(float *)field;
joined_r0x001cb084:
        if (fVar1 != 0.0) {
LAB_001cb0b4:
          SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 0x1b:
        if (*(char *)field != '\0') goto LAB_001cb0f0;
        break;
      case 0x1c:
      case 0x1f:
        if (*(long *)(((ulong)*field & 0xfffffffffffffffe) + 8) != 0) goto LAB_001cad45;
        break;
      case 0x1d:
        if (*field != 0.0) goto LAB_001cb217;
        break;
      case 0x1e:
        if (*field != 0.0) goto LAB_001cb2ec;
        break;
      case 0x20:
        fVar1 = *(float *)field;
joined_r0x001cb118:
        if (fVar1 != 0.0) {
          uVar2 = field_metadata_table->tag;
LAB_001cb122:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<13>::Serialize(field,output);
        }
        break;
      case 0x22:
        fVar1 = *(float *)field;
joined_r0x001caf83:
        if (fVar1 != 0.0) {
LAB_001cb4f8:
          SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                    (field,field_metadata_table,output);
        }
        break;
      case 0x23:
        if (*field != 0.0) goto LAB_001cb343;
        break;
      case 0x24:
        fVar1 = *(float *)field;
joined_r0x001cb35b:
        if (fVar1 != 0.0) {
          uVar2 = field_metadata_table->tag;
LAB_001cb3f0:
          uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          PrimitiveTypeHelper<17>::Serialize(field,output);
        }
        break;
      case 0x25:
        if (*field != 0.0) goto LAB_001cb494;
        break;
      case 0x28:
        RepeatedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x29:
        RepeatedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2a:
        RepeatedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2b:
        RepeatedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2c:
        RepeatedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2d:
        RepeatedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2e:
        RepeatedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x2f:
        RepeatedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x30:
      case 0x33:
        RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x31:
        RepeatedFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x32:
        RepeatedFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x34:
        RepeatedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x35:
        RepeatedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x36:
        RepeatedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x37:
        RepeatedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x38:
        RepeatedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x39:
        RepeatedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x3c:
        PackedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x3d:
        PackedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x3e:
        PackedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x3f:
        PackedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x40:
        PackedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x41:
        PackedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x42:
        PackedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x43:
        PackedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
        PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x48:
        PackedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x49:
        PackedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x4a:
        PackedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x4b:
        PackedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x4c:
        PackedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x4d:
        PackedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
        break;
      case 0x50:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_001cb240;
        break;
      case 0x51:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_001cb1ee;
        break;
      case 0x52:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_001cb444;
        break;
      case 0x53:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_001cb176;
        break;
      case 0x54:
      case 0x5d:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) != uVar2 >> 3) break;
        goto LAB_001cadcc;
      case 0x55:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_001cb2ce;
        break;
      case 0x56:
        if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
        break;
        goto LAB_001cb0b4;
      case 0x57:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_001cb0f0;
        break;
      case 0x58:
      case 0x5b:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_001cad91;
        break;
      case 0x59:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_001cb217;
        break;
      case 0x5a:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3) {
          uStack_38 = CONCAT44(field_metadata_table->tag,(undefined4)uStack_38);
          PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
          SerializeMessageTo<google::protobuf::io::CodedOutputStream>
                    ((MessageLite *)*field,field_metadata_table->ptr,output);
        }
        break;
      case 0x5c:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) != uVar2 >> 3) break;
        goto LAB_001cb122;
      case 0x5e:
        if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
        break;
        goto LAB_001cb4f8;
      case 0x5f:
        if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
        goto LAB_001cb343;
        break;
      case 0x60:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) != uVar2 >> 3) break;
        goto LAB_001cb3f0;
      case 0x61:
        uVar2 = field_metadata_table->tag;
        if (*(uint *)(base + field_metadata_table->has_offset) == uVar2 >> 3) goto LAB_001cb498;
        break;
      case 100:
        (*(code *)field_metadata_table->ptr)
                  (base,(ulong)field_metadata_table->offset,field_metadata_table->tag,
                   field_metadata_table->has_offset,output);
      }
LAB_001cb53d:
      field_metadata_table = field_metadata_table + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void SerializeInternal(const uint8* base,
                       const FieldMetadata* field_metadata_table,
                       int32 num_fields, io::CodedOutputStream* output) {
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);

      // Special cases
      case FieldMetadata::kSpecial:
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, output);
        break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
}